

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O0

void __thiscall Fl_Preferences::Node::createIndex(Node *this)

{
  int iVar1;
  Node **ppNVar2;
  int local_24;
  Node *pNStack_20;
  int i;
  Node *nd;
  int n;
  Node *this_local;
  
  if (((byte)this->field_0x30 >> 2 & 1) == 0) {
    iVar1 = nChildren(this);
    if (this->NIndex_ < iVar1) {
      this->NIndex_ = iVar1 + 0x10;
      ppNVar2 = (Node **)realloc(this->index_,(long)this->NIndex_ << 3);
      this->index_ = ppNVar2;
    }
    local_24 = 0;
    for (pNStack_20 = this->child_; pNStack_20 != (Node *)0x0; pNStack_20 = pNStack_20->next_) {
      this->index_[(iVar1 - local_24) + -1] = pNStack_20;
      local_24 = local_24 + 1;
    }
    this->nIndex_ = iVar1;
    this->field_0x30 = this->field_0x30 & 0xfb | 4;
  }
  return;
}

Assistant:

void Fl_Preferences::Node::createIndex() {
  if (indexed_) return;
  int n = nChildren();
  if (n>NIndex_) {
    NIndex_ = n + 16;
    index_ = (Node**)realloc(index_, NIndex_*sizeof(Node**));
  }
  Node *nd;
  int i = 0;
  for (nd = child_; nd; nd = nd->next_, i++) {
    index_[n-i-1] = nd;
  }
  nIndex_ = n;
  indexed_ = 1;
}